

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase *this,Context *context,char *name,char *desc,char *varName,
          GetConstantValueFunc getValue,ShaderType shaderType)

{
  GetConstantValueFunc __s;
  allocator<char> local_39;
  GetConstantValueFunc local_38;
  GetConstantValueFunc getValue_local;
  char *varName_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ShaderBuiltinConstantCase *this_local;
  
  local_38 = getValue;
  getValue_local = (GetConstantValueFunc)varName;
  varName_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  __s = getValue_local;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_03289260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_varName,(char *)__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  this->m_getValue = local_38;
  this->m_shaderType = shaderType;
  return;
}

Assistant:

ShaderBuiltinConstantCase::ShaderBuiltinConstantCase (Context& context, const char* name, const char* desc, const char* varName, GetConstantValueFunc getValue, glu::ShaderType shaderType)
	: TestCase		(context, name, desc)
	, m_varName		(varName)
	, m_getValue	(getValue)
	, m_shaderType	(shaderType)
{
}